

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::MultiNode<int,_int>::MultiNode(MultiNode<int,_int> *this,MultiNode<int,_int> *other)

{
  Chain *pCVar1;
  MultiNodeChain<int> **ppMVar2;
  Chain *pCVar3;
  
  this->key = other->key;
  pCVar3 = other->value;
  if (pCVar3 != (Chain *)0x0) {
    ppMVar2 = &this->value;
    do {
      pCVar1 = (Chain *)operator_new(0x10);
      pCVar1->value = pCVar3->value;
      pCVar1->next = (MultiNodeChain<int> *)0x0;
      *ppMVar2 = pCVar1;
      ppMVar2 = &pCVar1->next;
      pCVar3 = pCVar3->next;
    } while (pCVar3 != (MultiNodeChain<int> *)0x0);
  }
  return;
}

Assistant:

MultiNode(const MultiNode &other)
        : key(other.key)
    {
        Chain *c = other.value;
        Chain **e = &value;
        while (c) {
            Chain *chain = new Chain{ c->value, nullptr };
            *e = chain;
            e = &chain->next;
            c = c->next;
        }
    }